

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cc
# Opt level: O2

string * __thiscall
ipx::StatusString_abi_cxx11_(string *__return_storage_ptr__,ipx *this,Int status)

{
  const_iterator cVar1;
  long lVar2;
  initializer_list<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  allocator_type local_2ea;
  less<int> local_2e9;
  Int status_local;
  int local_2e4 [15];
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  status_name;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_278;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_250;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_228;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_200;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_188;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  
  status_local = (Int)this;
  local_2e4[0xe] = 0;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[8],_true>(&local_278,local_2e4 + 0xe,(char (*) [8])"not run");
  local_2e4[0xd] = 1000;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[7],_true>(&local_250,local_2e4 + 0xd,(char (*) [7])0x39f0c4);
  local_2e4[0xc] = 0x3ed;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[8],_true>(&local_228,local_2e4 + 0xc,(char (*) [8])"stopped");
  local_2e4[0xb] = 0x3ee;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[9],_true>(&local_200,local_2e4 + 0xb,(char (*) [9])"no model");
  local_2e4[10] = 0x3eb;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[14],_true>(&local_1d8,local_2e4 + 10,(char (*) [14])"out of memory");
  local_2e4[9] = 0x3ec;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[15],_true>(&local_1b0,local_2e4 + 9,(char (*) [15])"internal error");
  local_2e4[8] = 1;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[8],_true>(&local_188,local_2e4 + 8,(char (*) [8])0x3adac6);
  local_2e4[7] = 2;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[10],_true>(&local_160,local_2e4 + 7,(char (*) [10])0x39c6a0);
  local_2e4[6] = 3;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[14],_true>(&local_138,local_2e4 + 6,(char (*) [14])"primal infeas");
  local_2e4[5] = 4;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[12],_true>(&local_110,local_2e4 + 5,(char (*) [12])"dual infeas");
  local_2e4[4] = 6;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[11],_true>(&local_e8,local_2e4 + 4,(char (*) [11])"time limit");
  local_2e4[3] = 7;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[11],_true>(&local_c0,local_2e4 + 3,(char (*) [11])"iter limit");
  local_2e4[2] = 8;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[12],_true>(&local_98,local_2e4 + 2,(char (*) [12])"no progress");
  local_2e4[1] = 9;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[7],_true>(&local_70,local_2e4 + 1,(char (*) [7])0x3b65b9);
  local_2e4[0] = 10;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[6],_true>(&local_48,local_2e4,(char (*) [6])0x3ac22d);
  __l._M_len = 0xf;
  __l._M_array = &local_278;
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&status_name,__l,&local_2e9,&local_2ea);
  lVar2 = 0x238;
  do {
    std::__cxx11::string::~string((string *)((long)&local_278.first + lVar2));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x20);
  cVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&status_name._M_t,&status_local);
  if ((_Rb_tree_header *)cVar1._M_node == &status_name._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"unknown",(allocator *)&local_278)
    ;
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&cVar1._M_node[1]._M_parent);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&status_name._M_t);
  return __return_storage_ptr__;
}

Assistant:

std::string StatusString(Int status) {
    const std::map<int,std::string> status_name = {
        {IPX_STATUS_not_run, "not run"},
        {IPX_STATUS_solved, "solved"},
        {IPX_STATUS_stopped, "stopped"},
        {IPX_STATUS_no_model, "no model"},
        {IPX_STATUS_out_of_memory, "out of memory"},
        {IPX_STATUS_internal_error, "internal error"},
        {IPX_STATUS_optimal, "optimal"},
        {IPX_STATUS_imprecise, "imprecise"},
        {IPX_STATUS_primal_infeas, "primal infeas"},
        {IPX_STATUS_dual_infeas, "dual infeas"},
        {IPX_STATUS_time_limit, "time limit"},
        {IPX_STATUS_iter_limit, "iter limit"},
        {IPX_STATUS_no_progress, "no progress"},
        {IPX_STATUS_failed, "failed"},
        {IPX_STATUS_debug, "debug"}
    };
    auto entry = status_name.find(status);
    if (entry != status_name.end())
        return entry->second;
    return "unknown";
}